

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O3

void jsimd_idct_islow(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                     JSAMPARRAY output_buf,JDIMENSION output_col)

{
  short *psVar1;
  JSAMPROW pJVar2;
  uint6 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [14];
  undefined1 auVar8 [12];
  unkbyte10 Var9;
  undefined1 auVar10 [14];
  undefined1 auVar11 [12];
  unkbyte10 Var12;
  undefined1 auVar13 [12];
  unkbyte9 Var14;
  unkbyte9 Var15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined6 uVar20;
  undefined2 uVar21;
  undefined6 uVar22;
  undefined2 uVar23;
  undefined2 uVar24;
  int iVar25;
  int iVar28;
  undefined8 uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar35 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar26;
  int iVar53;
  int iVar54;
  int iVar57;
  int iVar58;
  int iVar61;
  int iVar62;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar27;
  int iVar55;
  int iVar59;
  int iVar63;
  undefined1 auVar45 [16];
  int iVar56;
  int iVar60;
  int iVar64;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar65;
  int iVar73;
  int iVar75;
  undefined1 auVar66 [16];
  short sVar74;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  int iVar76;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined2 uVar77;
  int iVar97;
  short sVar99;
  undefined1 auVar78 [12];
  short sVar101;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  short sVar98;
  short sVar100;
  short sVar102;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  int iVar103;
  int iVar111;
  short sVar112;
  int iVar113;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  int iVar114;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined4 uVar115;
  undefined4 uVar120;
  int iVar135;
  int iVar139;
  int iVar140;
  undefined1 auVar122 [12];
  int iVar134;
  undefined4 uVar138;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  int iVar136;
  int iVar137;
  int iVar141;
  int iVar142;
  int iVar143;
  int iVar144;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  int iVar145;
  undefined1 auVar147 [12];
  int iVar164;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  short sVar166;
  int iVar168;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  int iVar146;
  int iVar165;
  short sVar167;
  int iVar169;
  int iVar170;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar171 [12];
  char cVar182;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined2 uVar210;
  int iVar183;
  int iVar184;
  int iVar204;
  undefined1 auVar185 [12];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  int iVar206;
  int iVar208;
  undefined1 auVar197 [16];
  int iVar205;
  int iVar207;
  int iVar209;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  undefined4 uStack_c8;
  char cStack_c4;
  char cStack_c3;
  char cStack_c2;
  char cStack_c1;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  undefined8 uStack_18;
  undefined4 uVar29;
  undefined6 uVar30;
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar36 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar33 [12];
  undefined1 auVar39 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar34 [14];
  undefined1 auVar52 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar79 [12];
  undefined1 auVar95 [16];
  undefined1 auVar81 [16];
  undefined1 auVar80 [14];
  undefined1 auVar96 [16];
  undefined1 auVar91 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar121 [12];
  undefined1 auVar123 [12];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar133 [16];
  undefined1 auVar150 [16];
  undefined1 auVar155 [16];
  undefined1 auVar151 [16];
  undefined1 auVar156 [16];
  undefined1 auVar163 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar174 [16];
  undefined1 auVar179 [16];
  undefined1 auVar190 [16];
  undefined1 auVar202 [16];
  undefined1 auVar186 [16];
  undefined1 auVar191 [16];
  undefined1 auVar203 [16];
  undefined1 auVar200 [16];
  
  psVar1 = (short *)compptr->dct_table;
  if (((byte)simd_support & 0x80) != 0) {
    jsimd_idct_islow_avx2();
    return;
  }
  if (*(int *)(coef_block + 8) == 0 && *(int *)(coef_block + 0x10) == 0) {
    auVar66 = *(undefined1 (*) [16])(coef_block + 0x10) | *(undefined1 (*) [16])(coef_block + 0x20)
              | *(undefined1 (*) [16])(coef_block + 0x30) |
              *(undefined1 (*) [16])(coef_block + 8) | *(undefined1 (*) [16])(coef_block + 0x18) |
              *(undefined1 (*) [16])(coef_block + 0x28) | *(undefined1 (*) [16])(coef_block + 0x38);
    auVar66 = packsswb(auVar66,auVar66);
    auVar66 = packsswb(auVar66,auVar66);
    if (auVar66._0_4_ == 0) {
      auVar148._0_2_ = *coef_block * *psVar1;
      auVar148._2_2_ = coef_block[1] * psVar1[1];
      auVar148._4_2_ = coef_block[2] * psVar1[2];
      auVar148._6_2_ = coef_block[3] * psVar1[3];
      auVar148._8_2_ = coef_block[4] * psVar1[4];
      auVar148._10_2_ = coef_block[5] * psVar1[5];
      auVar148._12_2_ = coef_block[6] * psVar1[6];
      auVar148._14_2_ = coef_block[7] * psVar1[7];
      auVar66 = psllw(auVar148,2);
      auVar151._0_12_ = auVar66._0_12_;
      auVar151._12_2_ = auVar66._6_2_;
      auVar151._14_2_ = auVar66._6_2_;
      auVar150._12_4_ = auVar151._12_4_;
      auVar150._0_10_ = auVar66._0_10_;
      auVar150._10_2_ = auVar66._4_2_;
      auVar149._10_6_ = auVar150._10_6_;
      auVar149._0_8_ = auVar66._0_8_;
      auVar149._8_2_ = auVar66._4_2_;
      auVar4._4_8_ = auVar149._8_8_;
      auVar4._2_2_ = auVar66._2_2_;
      auVar4._0_2_ = auVar66._2_2_;
      uVar138 = CONCAT22(auVar66._0_2_,auVar66._0_2_);
      uVar115 = CONCAT22(auVar66._8_2_,auVar66._8_2_);
      auVar121._0_8_ = CONCAT26(auVar66._10_2_,CONCAT24(auVar66._10_2_,uVar115));
      auVar121._8_2_ = auVar66._12_2_;
      auVar121._10_2_ = auVar66._12_2_;
      auVar124._14_2_ = auVar66._14_2_;
      auVar124._12_2_ = auVar124._14_2_;
      auVar124._0_12_ = auVar121;
      uStack_50 = auVar4._0_4_;
      uVar29 = auVar149._8_4_;
      auVar192._4_4_ = uVar138;
      auVar192._0_4_ = uVar138;
      auVar192._8_4_ = uVar138;
      auVar192._12_4_ = uVar138;
      auVar69._4_4_ = uVar29;
      auVar69._0_4_ = uVar29;
      auVar69._8_4_ = uVar29;
      auVar69._12_4_ = uVar29;
      uStack_30._4_4_ = (int)((ulong)auVar121._0_8_ >> 0x20);
      uVar138 = auVar121._8_4_;
      uStack_20._4_4_ = auVar124._12_4_;
      auVar38._4_4_ = uVar115;
      auVar38._0_4_ = uVar115;
      auVar38._8_4_ = uVar115;
      auVar38._12_4_ = uVar115;
      auVar87._4_4_ = uVar138;
      auVar87._0_4_ = uVar138;
      auVar87._8_4_ = uVar138;
      auVar87._12_4_ = uVar138;
      uStack_48 = CONCAT44(uStack_50,uStack_50);
      uStack_40 = CONCAT44(auVar150._12_4_,auVar150._12_4_);
      uStack_38 = CONCAT44(auVar150._12_4_,auVar150._12_4_);
      uStack_30._0_4_ = uStack_30._4_4_;
      uStack_28._0_4_ = uStack_30._4_4_;
      uStack_28._4_4_ = uStack_30._4_4_;
      uStack_20._0_4_ = uStack_20._4_4_;
      uStack_18._0_4_ = uStack_20._4_4_;
      uStack_18._4_4_ = uStack_20._4_4_;
      uStack_4c = uStack_50;
      goto jsimd_idct_islow_sse2_column_end;
    }
  }
  auVar125._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(coef_block[0x33] * psVar1[0x33],coef_block[0x13] * psVar1[0x13]),
                          coef_block[0x32] * psVar1[0x32]),
                 CONCAT22(coef_block[0x12] * psVar1[0x12],coef_block[0x13] * psVar1[0x13])) >> 0x10)
  ;
  auVar125._6_2_ = coef_block[0x31] * psVar1[0x31];
  auVar125._4_2_ = coef_block[0x11] * psVar1[0x11];
  auVar125._2_2_ = coef_block[0x30] * psVar1[0x30];
  auVar125._0_2_ = coef_block[0x10] * psVar1[0x10];
  auVar152._2_2_ = coef_block[0x34] * psVar1[0x34];
  auVar152._0_2_ = coef_block[0x14] * psVar1[0x14];
  auVar152._4_2_ = coef_block[0x15] * psVar1[0x15];
  auVar152._6_2_ = coef_block[0x35] * psVar1[0x35];
  auVar152._8_2_ = coef_block[0x16] * psVar1[0x16];
  auVar152._10_2_ = coef_block[0x36] * psVar1[0x36];
  auVar152._12_2_ = coef_block[0x17] * psVar1[0x17];
  auVar152._14_2_ = coef_block[0x37] * psVar1[0x37];
  auVar88 = pmaddwd(auVar125,_jconst_idct_islow_sse2);
  auVar160 = pmaddwd(auVar152,_jconst_idct_islow_sse2);
  auVar66 = pmaddwd(auVar125,_PW_F054_MF130);
  auVar70 = pmaddwd(auVar152,_PW_F054_MF130);
  auVar16._10_2_ = coef_block[2] * psVar1[2] + coef_block[0x22] * psVar1[0x22];
  auVar16._0_10_ = (unkuint10)0;
  uVar3 = CONCAT24(coef_block[5] * psVar1[5] + coef_block[0x25] * psVar1[0x25],
                   (uint)(ushort)(coef_block[4] * psVar1[4] + coef_block[0x24] * psVar1[0x24]));
  auVar78._0_10_ = (unkuint10)uVar3 << 0x10;
  auVar78._10_2_ = coef_block[6] * psVar1[6] + coef_block[0x26] * psVar1[0x26];
  auVar81._12_2_ = 0;
  auVar81._0_12_ = auVar78;
  auVar81._14_2_ = coef_block[7] * psVar1[7] + coef_block[0x27] * psVar1[0x27];
  iVar26 = (int)((uint)(ushort)(*coef_block * *psVar1 + coef_block[0x20] * psVar1[0x20]) << 0x10) >>
           3;
  iVar53 = SUB164(ZEXT616(CONCAT42(auVar16._8_4_,
                                   coef_block[1] * psVar1[1] + coef_block[0x21] * psVar1[0x21])) <<
                  0x30,4) >> 3;
  iVar56 = auVar16._8_4_ >> 3;
  iVar63 = (int)auVar78._0_10_ >> 3;
  iVar75 = (int)((int6)uVar3 >> 0x13);
  iVar111 = auVar78._8_4_ >> 3;
  iVar118 = auVar81._12_4_ >> 3;
  iVar183 = iVar26 + auVar88._0_4_;
  iVar204 = iVar53 + auVar88._4_4_;
  iVar206 = iVar56 + auVar88._8_4_;
  iVar144 = auVar88._12_4_;
  iVar26 = iVar26 - auVar88._0_4_;
  iVar53 = iVar53 - auVar88._4_4_;
  iVar56 = iVar56 - auVar88._8_4_;
  iVar64 = iVar63 + auVar160._0_4_;
  iVar97 = iVar75 + auVar160._4_4_;
  iVar113 = iVar111 + auVar160._8_4_;
  iVar119 = iVar118 + auVar160._12_4_;
  iVar63 = iVar63 - auVar160._0_4_;
  iVar75 = iVar75 - auVar160._4_4_;
  iVar111 = iVar111 - auVar160._8_4_;
  iVar118 = iVar118 - auVar160._12_4_;
  auVar17._10_2_ = coef_block[2] * psVar1[2] - coef_block[0x22] * psVar1[0x22];
  auVar17._0_10_ = (unkuint10)0;
  uVar3 = CONCAT24(coef_block[5] * psVar1[5] - coef_block[0x25] * psVar1[0x25],
                   (uint)(ushort)(coef_block[4] * psVar1[4] - coef_block[0x24] * psVar1[0x24]));
  auVar185._0_10_ = (unkuint10)uVar3 << 0x10;
  auVar185._10_2_ = coef_block[6] * psVar1[6] - coef_block[0x26] * psVar1[0x26];
  auVar186._12_2_ = 0;
  auVar186._0_12_ = auVar185;
  auVar186._14_2_ = coef_block[7] * psVar1[7] - coef_block[0x27] * psVar1[0x27];
  iVar65 = (int)((uint)(ushort)(*coef_block * *psVar1 - coef_block[0x20] * psVar1[0x20]) << 0x10) >>
           3;
  iVar76 = SUB164(ZEXT616(CONCAT42(auVar17._8_4_,
                                   coef_block[1] * psVar1[1] - coef_block[0x21] * psVar1[0x21])) <<
                  0x30,4) >> 3;
  iVar114 = auVar17._8_4_ >> 3;
  iVar145 = (int)auVar185._0_10_ >> 3;
  iVar54 = (int)((int6)uVar3 >> 0x13);
  iVar57 = auVar185._8_4_ >> 3;
  iVar59 = auVar186._12_4_ >> 3;
  iVar165 = iVar65 + auVar66._0_4_;
  iVar170 = iVar76 + auVar66._4_4_;
  iVar168 = iVar114 + auVar66._8_4_;
  iVar62 = auVar66._12_4_;
  iVar65 = iVar65 - auVar66._0_4_;
  iVar76 = iVar76 - auVar66._4_4_;
  iVar114 = iVar114 - auVar66._8_4_;
  iVar25 = -iVar62;
  iVar184 = iVar145 + auVar70._0_4_;
  iVar205 = iVar54 + auVar70._4_4_;
  iVar207 = iVar57 + auVar70._8_4_;
  iVar208 = iVar59 + auVar70._12_4_;
  iVar145 = iVar145 - auVar70._0_4_;
  iVar54 = iVar54 - auVar70._4_4_;
  iVar57 = iVar57 - auVar70._8_4_;
  iVar59 = iVar59 - auVar70._12_4_;
  sVar74 = coef_block[0x2b] * psVar1[0x2b];
  sVar112 = coef_block[0x3b] * psVar1[0x3b];
  sVar166 = coef_block[0x1b] * psVar1[0x1b] + sVar112;
  auVar82._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(coef_block[0xb] * psVar1[0xb] + sVar74,sVar166),
                          coef_block[10] * psVar1[10] + coef_block[0x2a] * psVar1[0x2a]),
                 CONCAT22(coef_block[0x1a] * psVar1[0x1a] + coef_block[0x3a] * psVar1[0x3a],sVar166)
                ) >> 0x10);
  auVar82._6_2_ = coef_block[9] * psVar1[9] + coef_block[0x29] * psVar1[0x29];
  auVar82._4_2_ = coef_block[0x19] * psVar1[0x19] + coef_block[0x39] * psVar1[0x39];
  auVar82._2_2_ = coef_block[8] * psVar1[8] + coef_block[0x28] * psVar1[0x28];
  auVar82._0_2_ = coef_block[0x18] * psVar1[0x18] + coef_block[0x38] * psVar1[0x38];
  auVar66._2_2_ = coef_block[0xc] * psVar1[0xc] + coef_block[0x2c] * psVar1[0x2c];
  auVar66._0_2_ = coef_block[0x1c] * psVar1[0x1c] + coef_block[0x3c] * psVar1[0x3c];
  auVar66._4_2_ = coef_block[0x1d] * psVar1[0x1d] + coef_block[0x3d] * psVar1[0x3d];
  auVar66._6_2_ = coef_block[0xd] * psVar1[0xd] + coef_block[0x2d] * psVar1[0x2d];
  auVar66._8_2_ = coef_block[0x1e] * psVar1[0x1e] + coef_block[0x3e] * psVar1[0x3e];
  auVar66._10_2_ = coef_block[0xe] * psVar1[0xe] + coef_block[0x2e] * psVar1[0x2e];
  auVar66._12_2_ = coef_block[0x1f] * psVar1[0x1f] + coef_block[0x3f] * psVar1[0x3f];
  auVar66._14_2_ = coef_block[0xf] * psVar1[0xf] + coef_block[0x2f] * psVar1[0x2f];
  auVar160 = pmaddwd(auVar82,_PW_MF078_F117);
  auVar70 = pmaddwd(auVar66,_PW_MF078_F117);
  auVar161 = pmaddwd(auVar82,_PW_F117_F078);
  auVar194 = pmaddwd(auVar66,_PW_F117_F078);
  auVar83._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(coef_block[0xb] * psVar1[0xb],sVar112),
                          coef_block[10] * psVar1[10]),
                 CONCAT22(coef_block[0x3a] * psVar1[0x3a],sVar112)) >> 0x10);
  auVar83._6_2_ = coef_block[9] * psVar1[9];
  auVar83._4_2_ = coef_block[0x39] * psVar1[0x39];
  auVar83._2_2_ = coef_block[8] * psVar1[8];
  auVar83._0_2_ = coef_block[0x38] * psVar1[0x38];
  auVar88._2_2_ = coef_block[0xc] * psVar1[0xc];
  auVar88._0_2_ = coef_block[0x3c] * psVar1[0x3c];
  auVar88._4_2_ = coef_block[0x3d] * psVar1[0x3d];
  auVar88._6_2_ = coef_block[0xd] * psVar1[0xd];
  auVar88._8_2_ = coef_block[0x3e] * psVar1[0x3e];
  auVar88._10_2_ = coef_block[0xe] * psVar1[0xe];
  auVar88._12_2_ = coef_block[0x3f] * psVar1[0x3f];
  auVar88._14_2_ = coef_block[0xf] * psVar1[0xf];
  auVar180 = pmaddwd(auVar83,_PW_MF060_MF089);
  auVar66 = pmaddwd(auVar88,_PW_MF060_MF089);
  auVar129 = pmaddwd(auVar83,_PW_MF089_F060);
  auVar88 = pmaddwd(auVar88,_PW_MF089_F060);
  uStack_30._0_4_ = auVar160._0_4_;
  uStack_30._4_4_ = auVar160._4_4_;
  uStack_28._0_4_ = auVar160._8_4_;
  uStack_28._4_4_ = auVar160._12_4_;
  uStack_50 = auVar180._0_4_ + (int)uStack_30;
  uStack_4c = auVar180._4_4_ + uStack_30._4_4_;
  iVar116 = auVar180._8_4_ + (int)uStack_28;
  iVar134 = auVar180._12_4_ + uStack_28._4_4_;
  uStack_20._0_4_ = auVar70._0_4_;
  uStack_20._4_4_ = auVar70._4_4_;
  uStack_18._0_4_ = auVar70._8_4_;
  uStack_18._4_4_ = auVar70._12_4_;
  iVar27 = auVar66._0_4_ + (int)uStack_20;
  iVar164 = auVar66._4_4_ + uStack_20._4_4_;
  iVar58 = auVar66._8_4_ + (int)uStack_18;
  iVar60 = auVar66._12_4_ + uStack_18._4_4_;
  iVar136 = auVar129._0_4_ + auVar161._0_4_;
  iVar137 = auVar129._4_4_ + auVar161._4_4_;
  iVar139 = auVar129._8_4_ + auVar161._8_4_;
  iVar140 = auVar129._12_4_ + auVar161._12_4_;
  iVar141 = auVar88._0_4_ + auVar194._0_4_;
  iVar142 = auVar88._4_4_ + auVar194._4_4_;
  iVar143 = auVar88._8_4_ + auVar194._8_4_;
  iVar146 = auVar88._12_4_ + auVar194._12_4_;
  auVar84._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(coef_block[0x1b] * psVar1[0x1b],sVar74),
                          coef_block[0x1a] * psVar1[0x1a]),
                 CONCAT22(coef_block[0x2a] * psVar1[0x2a],sVar74)) >> 0x10);
  auVar84._6_2_ = coef_block[0x19] * psVar1[0x19];
  auVar84._4_2_ = coef_block[0x29] * psVar1[0x29];
  auVar84._2_2_ = coef_block[0x18] * psVar1[0x18];
  auVar84._0_2_ = coef_block[0x28] * psVar1[0x28];
  auVar70._2_2_ = coef_block[0x1c] * psVar1[0x1c];
  auVar70._0_2_ = coef_block[0x2c] * psVar1[0x2c];
  auVar70._4_2_ = coef_block[0x2d] * psVar1[0x2d];
  auVar70._6_2_ = coef_block[0x1d] * psVar1[0x1d];
  auVar70._8_2_ = coef_block[0x2e] * psVar1[0x2e];
  auVar70._10_2_ = coef_block[0x1e] * psVar1[0x1e];
  auVar70._12_2_ = coef_block[0x2f] * psVar1[0x2f];
  auVar70._14_2_ = coef_block[0x1f] * psVar1[0x1f];
  auVar160 = pmaddwd(auVar84,_PW_MF050_MF256);
  auVar66 = pmaddwd(auVar70,_PW_MF050_MF256);
  auVar88 = pmaddwd(auVar84,_PW_MF256_F050);
  auVar70 = pmaddwd(auVar70,_PW_MF256_F050);
  iVar73 = auVar160._0_4_ + auVar161._0_4_;
  iVar103 = auVar160._4_4_ + auVar161._4_4_;
  iVar117 = auVar160._8_4_ + auVar161._8_4_;
  iVar135 = auVar160._12_4_ + auVar161._12_4_;
  iVar28 = auVar66._0_4_ + auVar194._0_4_;
  iVar55 = auVar66._4_4_ + auVar194._4_4_;
  iVar169 = auVar66._8_4_ + auVar194._8_4_;
  iVar61 = auVar66._12_4_ + auVar194._12_4_;
  uStack_30._0_4_ = auVar88._0_4_ + (int)uStack_30;
  uStack_30._4_4_ = auVar88._4_4_ + uStack_30._4_4_;
  uStack_28._0_4_ = auVar88._8_4_ + (int)uStack_28;
  uStack_28._4_4_ = auVar88._12_4_ + uStack_28._4_4_;
  uStack_20._0_4_ = auVar70._0_4_ + (int)uStack_20;
  uStack_20._4_4_ = auVar70._4_4_ + uStack_20._4_4_;
  uStack_18._0_4_ = auVar70._8_4_ + (int)uStack_18;
  uStack_18._4_4_ = auVar70._12_4_ + uStack_18._4_4_;
  auVar153._0_4_ = iVar183 + iVar136 + 0x400 >> 0xb;
  auVar153._4_4_ = iVar204 + iVar137 + 0x400 >> 0xb;
  auVar153._8_4_ = iVar206 + iVar139 + 0x400 >> 0xb;
  auVar153._12_4_ = iVar144 + iVar140 + 0x400 >> 0xb;
  auVar187._0_4_ = iVar64 + iVar141 + 0x400 >> 0xb;
  auVar187._4_4_ = iVar97 + iVar142 + 0x400 >> 0xb;
  auVar187._8_4_ = iVar113 + iVar143 + 0x400 >> 0xb;
  auVar187._12_4_ = iVar119 + iVar146 + 0x400 >> 0xb;
  auVar85._0_4_ = (iVar183 - iVar136) + 0x400 >> 0xb;
  auVar85._4_4_ = (iVar204 - iVar137) + 0x400 >> 0xb;
  auVar85._8_4_ = (iVar206 - iVar139) + 0x400 >> 0xb;
  auVar85._12_4_ = (iVar144 - iVar140) + 0x400 >> 0xb;
  auVar160._0_4_ = (iVar64 - iVar141) + 0x400 >> 0xb;
  auVar160._4_4_ = (iVar97 - iVar142) + 0x400 >> 0xb;
  auVar160._8_4_ = (iVar113 - iVar143) + 0x400 >> 0xb;
  auVar160._12_4_ = (iVar119 - iVar146) + 0x400 >> 0xb;
  auVar88 = packssdw(auVar153,auVar187);
  auVar70 = packssdw(auVar85,auVar160);
  auVar126._0_4_ = iVar165 + (int)uStack_30 + 0x400 >> 0xb;
  auVar126._4_4_ = iVar170 + uStack_30._4_4_ + 0x400 >> 0xb;
  auVar126._8_4_ = iVar168 + (int)uStack_28 + 0x400 >> 0xb;
  auVar126._12_4_ = iVar62 + uStack_28._4_4_ + 0x400 >> 0xb;
  auVar104._0_4_ = iVar184 + (int)uStack_20 + 0x400 >> 0xb;
  auVar104._4_4_ = iVar205 + uStack_20._4_4_ + 0x400 >> 0xb;
  auVar104._8_4_ = iVar207 + (int)uStack_18 + 0x400 >> 0xb;
  auVar104._12_4_ = iVar208 + uStack_18._4_4_ + 0x400 >> 0xb;
  auVar188._0_4_ = (iVar165 - (int)uStack_30) + 0x400 >> 0xb;
  auVar188._4_4_ = (iVar170 - uStack_30._4_4_) + 0x400 >> 0xb;
  auVar188._8_4_ = (iVar168 - (int)uStack_28) + 0x400 >> 0xb;
  auVar188._12_4_ = (iVar62 - uStack_28._4_4_) + 0x400 >> 0xb;
  auVar180._0_4_ = (iVar184 - (int)uStack_20) + 0x400 >> 0xb;
  auVar180._4_4_ = (iVar205 - uStack_20._4_4_) + 0x400 >> 0xb;
  auVar180._8_4_ = (iVar207 - (int)uStack_18) + 0x400 >> 0xb;
  auVar180._12_4_ = (iVar208 - uStack_18._4_4_) + 0x400 >> 0xb;
  auVar66 = packssdw(auVar126,auVar104);
  auVar160 = packssdw(auVar188,auVar180);
  auVar156._0_12_ = auVar88._0_12_;
  auVar156._12_2_ = auVar88._6_2_;
  auVar156._14_2_ = auVar66._6_2_;
  auVar155._12_4_ = auVar156._12_4_;
  auVar155._0_10_ = auVar88._0_10_;
  auVar155._10_2_ = auVar66._4_2_;
  auVar154._10_6_ = auVar155._10_6_;
  auVar154._0_8_ = auVar88._0_8_;
  auVar154._8_2_ = auVar88._4_2_;
  auVar192._2_2_ = auVar66._0_2_;
  auVar192._0_2_ = auVar88._0_2_;
  auVar191._0_12_ = auVar160._0_12_;
  auVar191._12_2_ = auVar160._6_2_;
  auVar191._14_2_ = auVar70._6_2_;
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._0_10_ = auVar160._0_10_;
  auVar190._10_2_ = auVar70._4_2_;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._0_8_ = auVar160._0_8_;
  auVar189._8_2_ = auVar160._4_2_;
  auVar5._4_8_ = auVar189._8_8_;
  auVar5._2_2_ = auVar70._2_2_;
  auVar5._0_2_ = auVar160._2_2_;
  auVar192._14_2_ = auVar70._0_2_;
  auVar192._12_2_ = auVar160._0_2_;
  uStack_c0 = CONCAT22(auVar66._8_2_,auVar88._8_2_);
  _uStack_c0 = CONCAT24(auVar88._10_2_,uStack_c0);
  _uStack_c0 = CONCAT26(auVar66._10_2_,_uStack_c0);
  uStack_b8._0_2_ = auVar88._12_2_;
  uStack_b8._2_2_ = auVar66._12_2_;
  auVar6 = _uStack_c0;
  uStack_b4._0_2_ = auVar88._14_2_;
  uStack_b4._2_2_ = auVar66._14_2_;
  auVar66 = _uStack_c0;
  uStack_80 = CONCAT22(auVar70._8_2_,auVar160._8_2_);
  uStack_7c = CONCAT22(auVar70._10_2_,auVar160._10_2_);
  uStack_78 = CONCAT22(auVar70._12_2_,auVar160._12_2_);
  uStack_74 = CONCAT22(auVar70._14_2_,auVar160._14_2_);
  auVar105._0_4_ = iVar65 + iVar73 + 0x400 >> 0xb;
  auVar105._4_4_ = iVar76 + iVar103 + 0x400 >> 0xb;
  auVar105._8_4_ = iVar114 + iVar117 + 0x400 >> 0xb;
  auVar105._12_4_ = iVar25 + iVar135 + 0x400 >> 0xb;
  auVar129._0_4_ = iVar145 + iVar28 + 0x400 >> 0xb;
  auVar129._4_4_ = iVar54 + iVar55 + 0x400 >> 0xb;
  auVar129._8_4_ = iVar57 + iVar169 + 0x400 >> 0xb;
  auVar129._12_4_ = iVar59 + iVar61 + 0x400 >> 0xb;
  auVar157._0_4_ = (iVar65 - iVar73) + 0x400 >> 0xb;
  auVar157._4_4_ = (iVar76 - iVar103) + 0x400 >> 0xb;
  auVar157._8_4_ = (iVar114 - iVar117) + 0x400 >> 0xb;
  auVar157._12_4_ = (iVar25 - iVar135) + 0x400 >> 0xb;
  auVar172._0_4_ = (iVar145 - iVar28) + 0x400 >> 0xb;
  auVar172._4_4_ = (iVar54 - iVar55) + 0x400 >> 0xb;
  auVar172._8_4_ = (iVar57 - iVar169) + 0x400 >> 0xb;
  auVar172._12_4_ = (iVar59 - iVar61) + 0x400 >> 0xb;
  auVar160 = packssdw(auVar105,auVar129);
  auVar180 = packssdw(auVar157,auVar172);
  auVar67._0_4_ = iVar26 + uStack_50 + 0x400 >> 0xb;
  auVar67._4_4_ = iVar53 + uStack_4c + 0x400 >> 0xb;
  auVar67._8_4_ = iVar56 + iVar116 + 0x400 >> 0xb;
  auVar67._12_4_ = -iVar144 + iVar134 + 0x400 >> 0xb;
  auVar127._0_4_ = iVar63 + iVar27 + 0x400 >> 0xb;
  auVar127._4_4_ = iVar75 + iVar164 + 0x400 >> 0xb;
  auVar127._8_4_ = iVar111 + iVar58 + 0x400 >> 0xb;
  auVar127._12_4_ = iVar118 + iVar60 + 0x400 >> 0xb;
  auVar161._0_4_ = (iVar26 - uStack_50) + 0x400 >> 0xb;
  auVar161._4_4_ = (iVar53 - uStack_4c) + 0x400 >> 0xb;
  auVar161._8_4_ = (iVar56 - iVar116) + 0x400 >> 0xb;
  auVar161._12_4_ = (-iVar144 - iVar134) + 0x400 >> 0xb;
  auVar173._0_4_ = (iVar63 - iVar27) + 0x400 >> 0xb;
  auVar173._4_4_ = (iVar75 - iVar164) + 0x400 >> 0xb;
  auVar173._8_4_ = (iVar111 - iVar58) + 0x400 >> 0xb;
  auVar173._12_4_ = (iVar118 - iVar60) + 0x400 >> 0xb;
  auVar88 = packssdw(auVar67,auVar127);
  auVar70 = packssdw(auVar161,auVar173);
  uStack_c8 = auVar154._8_4_;
  uStack_b8 = auVar6._8_4_;
  uStack_b4 = auVar66._12_4_;
  auVar108._0_12_ = auVar160._0_12_;
  auVar108._12_2_ = auVar160._6_2_;
  auVar108._14_2_ = auVar88._6_2_;
  auVar107._12_4_ = auVar108._12_4_;
  auVar107._0_10_ = auVar160._0_10_;
  auVar107._10_2_ = auVar88._4_2_;
  auVar106._10_6_ = auVar107._10_6_;
  auVar106._0_8_ = auVar160._0_8_;
  auVar106._8_2_ = auVar160._4_2_;
  auVar192._6_2_ = auVar88._0_2_;
  auVar192._4_2_ = auVar160._0_2_;
  auVar196._0_12_ = auVar70._0_12_;
  auVar196._12_2_ = auVar70._6_2_;
  auVar196._14_2_ = auVar180._6_2_;
  auVar36._12_4_ = auVar196._12_4_;
  auVar36._0_10_ = auVar70._0_10_;
  auVar36._10_2_ = auVar180._4_2_;
  auVar194._10_6_ = auVar36._10_6_;
  auVar194._0_8_ = auVar70._0_8_;
  auVar194._8_2_ = auVar70._4_2_;
  auVar6._4_8_ = auVar194._8_8_;
  auVar6._2_2_ = auVar180._2_2_;
  auVar6._0_2_ = auVar70._2_2_;
  auVar35._0_4_ = CONCAT22(auVar180._0_2_,auVar70._0_2_);
  auVar35._4_12_ = auVar6;
  uVar115 = CONCAT22(auVar180._8_2_,auVar70._8_2_);
  auVar171._0_8_ = CONCAT26(auVar180._10_2_,CONCAT24(auVar70._10_2_,uVar115));
  auVar171._8_2_ = auVar70._12_2_;
  auVar171._10_2_ = auVar180._12_2_;
  auVar174._12_2_ = auVar70._14_2_;
  auVar174._0_12_ = auVar171;
  auVar174._14_2_ = auVar180._14_2_;
  auVar68._0_8_ = CONCAT44(auVar106._8_4_,uStack_c8);
  auVar68._8_4_ = auVar155._12_4_;
  auVar68._12_4_ = auVar107._12_4_;
  uStack_8c = auVar5._0_4_;
  uStack_88 = auVar189._8_4_;
  auVar37._0_8_ = auVar35._0_8_;
  auVar37._8_4_ = auVar6._0_4_;
  auVar37._12_4_ = uStack_8c;
  uStack_48 = auVar37._8_8_;
  auVar192._8_4_ = auVar35._0_4_;
  auVar86._0_8_ = CONCAT44(uStack_88,auVar194._8_4_);
  auVar86._8_4_ = auVar36._12_4_;
  auVar86._12_4_ = auVar190._12_4_;
  auVar175._8_4_ = (int)((ulong)auVar171._0_8_ >> 0x20);
  auVar175._0_8_ = auVar171._0_8_;
  auVar175._12_4_ = uStack_7c;
  auVar38._12_4_ = uStack_80;
  auVar38._8_4_ = uVar115;
  auVar158._0_8_ = CONCAT44(uStack_78,auVar171._8_4_);
  auVar158._8_4_ = auVar174._12_4_;
  auVar158._12_4_ = uStack_74;
  auVar69._8_8_ = auVar86._0_8_;
  auVar69._0_8_ = auVar68._0_8_;
  uStack_40 = auVar68._8_8_;
  uStack_38 = auVar86._8_8_;
  auVar38._4_2_ = auVar160._8_2_;
  auVar38._0_4_ = uStack_c0;
  auVar38._6_2_ = auVar88._8_2_;
  uStack_30._4_4_ = iVar25;
  uStack_30._0_4_ = uStack_bc;
  auVar87._4_4_ = iVar54;
  auVar87._0_4_ = uStack_b8;
  uStack_20._4_2_ = auVar160._12_2_;
  uStack_20._0_4_ = uStack_b4;
  uStack_20._6_2_ = auVar88._12_2_;
  auVar87._8_8_ = auVar158._0_8_;
  uStack_28 = auVar175._8_8_;
  uStack_18 = auVar158._8_8_;
jsimd_idct_islow_sse2_column_end:
  auVar66 = _uStack_30;
  auVar179._0_12_ = auVar69._0_12_;
  auVar179._12_2_ = auVar69._6_2_;
  auVar179._14_2_ = auVar87._6_2_;
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._0_10_ = auVar69._0_10_;
  auVar178._10_2_ = auVar87._4_2_;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._0_8_ = auVar69._0_8_;
  auVar177._8_2_ = auVar69._4_2_;
  auVar176._8_8_ = auVar177._8_8_;
  auVar176._6_2_ = auVar87._2_2_;
  auVar176._4_2_ = auVar69._2_2_;
  auVar176._0_2_ = auVar69._0_2_;
  auVar176._2_2_ = auVar87._0_2_;
  auVar159._2_2_ = auVar87._8_2_;
  auVar159._0_2_ = auVar69._8_2_;
  auVar159._4_2_ = auVar69._10_2_;
  auVar159._6_2_ = auVar87._10_2_;
  auVar159._8_2_ = auVar69._12_2_;
  auVar159._10_2_ = auVar87._12_2_;
  auVar159._12_2_ = auVar69._14_2_;
  auVar159._14_2_ = auVar87._14_2_;
  auVar180 = pmaddwd(auVar176,_jconst_idct_islow_sse2);
  auVar160 = pmaddwd(auVar159,_jconst_idct_islow_sse2);
  auVar70 = pmaddwd(auVar176,_PW_F054_MF130);
  auVar88 = pmaddwd(auVar159,_PW_F054_MF130);
  auVar18._10_2_ = auVar192._4_2_ + auVar38._4_2_;
  auVar18._0_10_ = (unkuint10)0;
  uVar3 = CONCAT24(auVar192._10_2_ + auVar38._10_2_,(uint)(ushort)(auVar192._8_2_ + auVar38._8_2_));
  auVar32._0_10_ = (unkuint10)uVar3 << 0x10;
  auVar32._10_2_ = auVar192._12_2_ + auVar38._12_2_;
  auVar39._12_2_ = 0;
  auVar39._0_12_ = auVar32;
  auVar39._14_2_ = auVar192._14_2_ + auVar38._14_2_;
  iVar116 = (int)((uint)(ushort)(auVar192._0_2_ + auVar38._0_2_) << 0x10) >> 3;
  iVar134 = SUB164(ZEXT616(CONCAT42(auVar18._8_4_,auVar192._2_2_ + auVar38._2_2_)) << 0x30,4) >> 3;
  iVar139 = auVar18._8_4_ >> 3;
  iVar25 = (int)auVar32._0_10_ >> 3;
  iVar53 = (int)((int6)uVar3 >> 0x13);
  iVar57 = auVar32._8_4_ >> 3;
  iVar61 = auVar39._12_4_ >> 3;
  iVar117 = iVar116 + auVar180._0_4_;
  iVar135 = iVar134 + auVar180._4_4_;
  iVar140 = iVar139 + auVar180._8_4_;
  iVar168 = auVar180._12_4_;
  iVar116 = iVar116 - auVar180._0_4_;
  iVar134 = iVar134 - auVar180._4_4_;
  iVar139 = iVar139 - auVar180._8_4_;
  iVar26 = iVar25 + auVar160._0_4_;
  iVar54 = iVar53 + auVar160._4_4_;
  iVar58 = iVar57 + auVar160._8_4_;
  iVar62 = iVar61 + auVar160._12_4_;
  iVar25 = iVar25 - auVar160._0_4_;
  iVar53 = iVar53 - auVar160._4_4_;
  iVar57 = iVar57 - auVar160._8_4_;
  iVar61 = iVar61 - auVar160._12_4_;
  auVar19._10_2_ = auVar192._4_2_ - auVar38._4_2_;
  auVar19._0_10_ = (unkuint10)0;
  uVar3 = CONCAT24(auVar192._10_2_ - auVar38._10_2_,(uint)(ushort)(auVar192._8_2_ - auVar38._8_2_));
  auVar122._0_10_ = (unkuint10)uVar3 << 0x10;
  auVar122._10_2_ = auVar192._12_2_ - auVar38._12_2_;
  auVar128._12_2_ = 0;
  auVar128._0_12_ = auVar122;
  auVar128._14_2_ = auVar192._14_2_ - auVar38._14_2_;
  iVar145 = (int)((uint)(ushort)(auVar192._0_2_ - auVar38._0_2_) << 0x10) >> 3;
  iVar164 = SUB164(ZEXT616(CONCAT42(auVar19._8_4_,auVar192._2_2_ - auVar38._2_2_)) << 0x30,4) >> 3;
  iVar169 = auVar19._8_4_ >> 3;
  iVar118 = (int)auVar122._0_10_ >> 3;
  iVar136 = (int)((int6)uVar3 >> 0x13);
  iVar141 = auVar122._8_4_ >> 3;
  iVar143 = auVar128._12_4_ >> 3;
  iVar146 = iVar145 + auVar70._0_4_;
  iVar165 = iVar164 + auVar70._4_4_;
  iVar170 = iVar169 + auVar70._8_4_;
  iVar97 = auVar70._12_4_;
  iVar145 = iVar145 - auVar70._0_4_;
  iVar164 = iVar164 - auVar70._4_4_;
  iVar169 = iVar169 - auVar70._8_4_;
  iVar119 = iVar118 + auVar88._0_4_;
  iVar137 = iVar136 + auVar88._4_4_;
  iVar142 = iVar141 + auVar88._8_4_;
  iVar144 = iVar143 + auVar88._12_4_;
  iVar118 = iVar118 - auVar88._0_4_;
  iVar136 = iVar136 - auVar88._4_4_;
  iVar141 = iVar141 - auVar88._8_4_;
  iVar143 = iVar143 - auVar88._12_4_;
  sVar167 = uStack_40._6_2_ + uStack_20._6_2_;
  sVar74 = (short)uStack_30;
  sVar112 = uStack_30._2_2_;
  sVar166 = uStack_30._4_2_;
  sVar98 = uStack_30._6_2_;
  sVar99 = uStack_30._8_2_;
  sVar100 = uStack_30._10_2_;
  sVar101 = uStack_30._12_2_;
  sVar102 = uStack_30._14_2_;
  auVar40._8_8_ =
       (undefined8)
       (CONCAT64(CONCAT42(CONCAT22(uStack_4c._2_2_ + sVar98,sVar167),(short)uStack_4c + sVar166),
                 CONCAT22(uStack_40._4_2_ + uStack_20._4_2_,sVar167)) >> 0x10);
  auVar40._6_2_ = uStack_50._2_2_ + sVar112;
  auVar40._4_2_ = uStack_40._2_2_ + uStack_20._2_2_;
  auVar40._2_2_ = (short)uStack_50 + sVar74;
  auVar40._0_2_ = (short)uStack_40 + (short)uStack_20;
  auVar193._2_2_ = (short)uStack_48 + sVar99;
  auVar193._0_2_ = (short)uStack_38 + uStack_20._8_2_;
  auVar193._4_2_ = uStack_38._2_2_ + uStack_20._10_2_;
  auVar193._6_2_ = uStack_48._2_2_ + sVar100;
  auVar193._8_2_ = uStack_38._4_2_ + uStack_20._12_2_;
  auVar193._10_2_ = uStack_48._4_2_ + sVar101;
  auVar193._12_2_ = uStack_38._6_2_ + uStack_20._14_2_;
  auVar193._14_2_ = uStack_48._6_2_ + sVar102;
  auVar70 = pmaddwd(auVar40,_PW_MF078_F117);
  auVar194 = pmaddwd(auVar193,_PW_MF078_F117);
  auVar161 = pmaddwd(auVar40,_PW_F117_F078);
  auVar129 = pmaddwd(auVar193,_PW_F117_F078);
  auVar44._0_12_ = uStack_20._0_12_;
  auVar44._12_2_ = uStack_20._6_2_;
  auVar44._14_2_ = uStack_4c._2_2_;
  auVar43._12_4_ = auVar44._12_4_;
  auVar43._0_10_ = (unkbyte10)uStack_20;
  auVar43._10_2_ = (short)uStack_4c;
  auVar42._10_6_ = auVar43._10_6_;
  auVar42._0_8_ = uStack_20;
  auVar42._8_2_ = uStack_20._4_2_;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._6_2_ = uStack_50._2_2_;
  auVar41._4_2_ = uStack_20._2_2_;
  auVar41._2_2_ = (short)uStack_50;
  auVar41._0_2_ = (short)uStack_20;
  auVar195._2_2_ = (short)uStack_48;
  auVar195._0_2_ = uStack_20._8_2_;
  auVar195._4_2_ = uStack_20._10_2_;
  auVar195._6_2_ = uStack_48._2_2_;
  auVar195._8_2_ = uStack_20._12_2_;
  auVar195._10_2_ = uStack_48._4_2_;
  auVar195._12_2_ = uStack_20._14_2_;
  auVar195._14_2_ = uStack_48._6_2_;
  auVar88 = pmaddwd(auVar41,_PW_MF060_MF089);
  auVar196 = pmaddwd(auVar195,_PW_MF060_MF089);
  auVar160 = pmaddwd(auVar41,_PW_MF089_F060);
  auVar180 = pmaddwd(auVar195,_PW_MF089_F060);
  uStack_30._0_4_ = auVar70._0_4_;
  uStack_30._4_4_ = auVar70._4_4_;
  uStack_28._0_4_ = auVar70._8_4_;
  uStack_28._4_4_ = auVar70._12_4_;
  iVar27 = auVar88._0_4_ + (int)uStack_30;
  iVar55 = auVar88._4_4_ + uStack_30._4_4_;
  iVar59 = auVar88._8_4_ + (int)uStack_28;
  iVar63 = auVar88._12_4_ + uStack_28._4_4_;
  uStack_20._0_4_ = auVar194._0_4_;
  uStack_20._4_4_ = auVar194._4_4_;
  uStack_18._0_4_ = auVar194._8_4_;
  uStack_18._4_4_ = auVar194._12_4_;
  iVar183 = auVar196._0_4_ + (int)uStack_20;
  iVar204 = auVar196._4_4_ + uStack_20._4_4_;
  iVar206 = auVar196._8_4_ + (int)uStack_18;
  iVar208 = auVar196._12_4_ + uStack_18._4_4_;
  iVar65 = auVar160._0_4_ + auVar161._0_4_;
  iVar73 = auVar160._4_4_ + auVar161._4_4_;
  iVar75 = auVar160._8_4_ + auVar161._8_4_;
  iVar76 = auVar160._12_4_ + auVar161._12_4_;
  iVar103 = auVar180._0_4_ + auVar129._0_4_;
  iVar111 = auVar180._4_4_ + auVar129._4_4_;
  iVar113 = auVar180._8_4_ + auVar129._8_4_;
  iVar114 = auVar180._12_4_ + auVar129._12_4_;
  auVar48._0_12_ = auVar66._0_12_;
  auVar48._12_2_ = sVar98;
  auVar48._14_2_ = uStack_40._6_2_;
  auVar47._12_4_ = auVar48._12_4_;
  auVar47._0_10_ = auVar66._0_10_;
  auVar47._10_2_ = uStack_40._4_2_;
  auVar46._10_6_ = auVar47._10_6_;
  auVar46._0_8_ = auVar66._0_8_;
  auVar46._8_2_ = sVar166;
  auVar45._8_8_ = auVar46._8_8_;
  auVar45._6_2_ = uStack_40._2_2_;
  auVar45._4_2_ = sVar112;
  auVar45._2_2_ = (short)uStack_40;
  auVar45._0_2_ = sVar74;
  auVar197._2_2_ = (short)uStack_38;
  auVar197._0_2_ = sVar99;
  auVar197._4_2_ = sVar100;
  auVar197._6_2_ = uStack_38._2_2_;
  auVar197._8_2_ = sVar101;
  auVar197._10_2_ = uStack_38._4_2_;
  auVar197._12_2_ = sVar102;
  auVar197._14_2_ = uStack_38._6_2_;
  auVar66 = pmaddwd(auVar45,_PW_MF050_MF256);
  auVar160 = pmaddwd(auVar197,_PW_MF050_MF256);
  auVar70 = pmaddwd(auVar45,_PW_MF256_F050);
  auVar88 = pmaddwd(auVar197,_PW_MF256_F050);
  iVar28 = auVar66._0_4_ + auVar161._0_4_;
  iVar56 = auVar66._4_4_ + auVar161._4_4_;
  iVar60 = auVar66._8_4_ + auVar161._8_4_;
  iVar64 = auVar66._12_4_ + auVar161._12_4_;
  iVar184 = auVar160._0_4_ + auVar129._0_4_;
  iVar205 = auVar160._4_4_ + auVar129._4_4_;
  iVar207 = auVar160._8_4_ + auVar129._8_4_;
  iVar209 = auVar160._12_4_ + auVar129._12_4_;
  uStack_30._0_4_ = auVar70._0_4_ + (int)uStack_30;
  uStack_30._4_4_ = auVar70._4_4_ + uStack_30._4_4_;
  uStack_28._0_4_ = auVar70._8_4_ + (int)uStack_28;
  uStack_28._4_4_ = auVar70._12_4_ + uStack_28._4_4_;
  uStack_20._0_4_ = auVar88._0_4_ + (int)uStack_20;
  uStack_20._4_4_ = auVar88._4_4_ + uStack_20._4_4_;
  uStack_18._0_4_ = auVar88._8_4_ + (int)uStack_18;
  uStack_18._4_4_ = auVar88._12_4_ + uStack_18._4_4_;
  auVar162._0_4_ = iVar117 + iVar65 + 0x20000 >> 0x12;
  auVar162._4_4_ = iVar135 + iVar73 + 0x20000 >> 0x12;
  auVar162._8_4_ = iVar140 + iVar75 + 0x20000 >> 0x12;
  auVar162._12_4_ = iVar168 + iVar76 + 0x20000 >> 0x12;
  auVar130._0_4_ = iVar26 + iVar103 + 0x20000 >> 0x12;
  auVar130._4_4_ = iVar54 + iVar111 + 0x20000 >> 0x12;
  auVar130._8_4_ = iVar58 + iVar113 + 0x20000 >> 0x12;
  auVar130._12_4_ = iVar62 + iVar114 + 0x20000 >> 0x12;
  auVar49._0_4_ = (iVar117 - iVar65) + 0x20000 >> 0x12;
  auVar49._4_4_ = (iVar135 - iVar73) + 0x20000 >> 0x12;
  auVar49._8_4_ = (iVar140 - iVar75) + 0x20000 >> 0x12;
  auVar49._12_4_ = (iVar168 - iVar76) + 0x20000 >> 0x12;
  auVar198._0_4_ = (iVar26 - iVar103) + 0x20000 >> 0x12;
  auVar198._4_4_ = (iVar54 - iVar111) + 0x20000 >> 0x12;
  auVar198._8_4_ = (iVar58 - iVar113) + 0x20000 >> 0x12;
  auVar198._12_4_ = (iVar62 - iVar114) + 0x20000 >> 0x12;
  auVar160 = packssdw(auVar162,auVar130);
  auVar66 = packssdw(auVar49,auVar198);
  auVar109._0_4_ = iVar146 + (int)uStack_30 + 0x20000 >> 0x12;
  auVar109._4_4_ = iVar165 + uStack_30._4_4_ + 0x20000 >> 0x12;
  auVar109._8_4_ = iVar170 + (int)uStack_28 + 0x20000 >> 0x12;
  auVar109._12_4_ = iVar97 + uStack_28._4_4_ + 0x20000 >> 0x12;
  auVar71._0_4_ = iVar119 + (int)uStack_20 + 0x20000 >> 0x12;
  auVar71._4_4_ = iVar137 + uStack_20._4_4_ + 0x20000 >> 0x12;
  auVar71._8_4_ = iVar142 + (int)uStack_18 + 0x20000 >> 0x12;
  auVar71._12_4_ = iVar144 + uStack_18._4_4_ + 0x20000 >> 0x12;
  auVar131._0_4_ = (iVar146 - (int)uStack_30) + 0x20000 >> 0x12;
  auVar131._4_4_ = (iVar165 - uStack_30._4_4_) + 0x20000 >> 0x12;
  auVar131._8_4_ = (iVar170 - (int)uStack_28) + 0x20000 >> 0x12;
  auVar131._12_4_ = (iVar97 - uStack_28._4_4_) + 0x20000 >> 0x12;
  auVar199._0_4_ = (iVar119 - (int)uStack_20) + 0x20000 >> 0x12;
  auVar199._4_4_ = (iVar137 - uStack_20._4_4_) + 0x20000 >> 0x12;
  auVar199._8_4_ = (iVar142 - (int)uStack_18) + 0x20000 >> 0x12;
  auVar199._12_4_ = (iVar144 - uStack_18._4_4_) + 0x20000 >> 0x12;
  auVar70 = packssdw(auVar109,auVar71);
  auVar88 = packssdw(auVar131,auVar199);
  auVar180 = packsswb(auVar160,auVar88);
  auVar70 = packsswb(auVar70,auVar66);
  auVar181._0_4_ = iVar145 + iVar28 + 0x20000 >> 0x12;
  auVar181._4_4_ = iVar164 + iVar56 + 0x20000 >> 0x12;
  auVar181._8_4_ = iVar169 + iVar60 + 0x20000 >> 0x12;
  auVar181._12_4_ = -iVar97 + iVar64 + 0x20000 >> 0x12;
  auVar89._0_4_ = iVar118 + iVar184 + 0x20000 >> 0x12;
  auVar89._4_4_ = iVar136 + iVar205 + 0x20000 >> 0x12;
  auVar89._8_4_ = iVar141 + iVar207 + 0x20000 >> 0x12;
  auVar89._12_4_ = iVar143 + iVar209 + 0x20000 >> 0x12;
  auVar132._0_4_ = (iVar145 - iVar28) + 0x20000 >> 0x12;
  auVar132._4_4_ = (iVar164 - iVar56) + 0x20000 >> 0x12;
  auVar132._8_4_ = (iVar169 - iVar60) + 0x20000 >> 0x12;
  auVar132._12_4_ = (-iVar97 - iVar64) + 0x20000 >> 0x12;
  auVar50._0_4_ = (iVar118 - iVar184) + 0x20000 >> 0x12;
  auVar50._4_4_ = (iVar136 - iVar205) + 0x20000 >> 0x12;
  auVar50._8_4_ = (iVar141 - iVar207) + 0x20000 >> 0x12;
  auVar50._12_4_ = (iVar143 - iVar209) + 0x20000 >> 0x12;
  auVar129 = packssdw(auVar181,auVar89);
  auVar160 = packssdw(auVar132,auVar50);
  auVar110._0_4_ = iVar116 + iVar27 + 0x20000 >> 0x12;
  auVar110._4_4_ = iVar134 + iVar55 + 0x20000 >> 0x12;
  auVar110._8_4_ = iVar139 + iVar59 + 0x20000 >> 0x12;
  auVar110._12_4_ = -iVar168 + iVar63 + 0x20000 >> 0x12;
  auVar72._0_4_ = iVar25 + iVar183 + 0x20000 >> 0x12;
  auVar72._4_4_ = iVar53 + iVar204 + 0x20000 >> 0x12;
  auVar72._8_4_ = iVar57 + iVar206 + 0x20000 >> 0x12;
  auVar72._12_4_ = iVar61 + iVar208 + 0x20000 >> 0x12;
  auVar90._0_4_ = (iVar116 - iVar27) + 0x20000 >> 0x12;
  auVar90._4_4_ = (iVar134 - iVar55) + 0x20000 >> 0x12;
  auVar90._8_4_ = (iVar139 - iVar59) + 0x20000 >> 0x12;
  auVar90._12_4_ = (-iVar168 - iVar63) + 0x20000 >> 0x12;
  auVar51._0_4_ = (iVar25 - iVar183) + 0x20000 >> 0x12;
  auVar51._4_4_ = (iVar53 - iVar204) + 0x20000 >> 0x12;
  auVar51._8_4_ = (iVar57 - iVar206) + 0x20000 >> 0x12;
  auVar51._12_4_ = (iVar61 - iVar208) + 0x20000 >> 0x12;
  auVar88 = packssdw(auVar110,auVar72);
  auVar66 = packssdw(auVar90,auVar51);
  cStack_d0 = auVar180[0];
  cStack_cf = auVar180[1];
  cStack_ce = auVar180[2];
  cStack_cd = auVar180[3];
  cStack_cc = auVar180[4];
  cStack_cb = auVar180[5];
  cStack_ca = auVar180[6];
  cStack_c9 = auVar180[7];
  uStack_c8._0_1_ = auVar180[8];
  uStack_c8._1_1_ = auVar180[9];
  uStack_c8._2_1_ = auVar180[10];
  uStack_c8._3_1_ = auVar180[0xb];
  cStack_c4 = auVar180[0xc];
  cStack_c3 = auVar180[0xd];
  cStack_c2 = auVar180[0xe];
  cStack_c1 = auVar180[0xf];
  uStack_c0._0_1_ = auVar70[0];
  uStack_c0._1_1_ = auVar70[1];
  uStack_c0._2_1_ = auVar70[2];
  uStack_c0._3_1_ = auVar70[3];
  uStack_bc._0_1_ = auVar70[4];
  uStack_bc._1_1_ = auVar70[5];
  uStack_bc._2_1_ = auVar70[6];
  uStack_bc._3_1_ = auVar70[7];
  uStack_b8._0_1_ = auVar70[8];
  uStack_b8._1_1_ = auVar70[9];
  uStack_b8._2_1_ = auVar70[10];
  uStack_b8._3_1_ = auVar70[0xb];
  uStack_b4._0_1_ = auVar70[0xc];
  uStack_b4._1_1_ = auVar70[0xd];
  uStack_b4._2_1_ = auVar70[0xe];
  uStack_b4._3_1_ = auVar70[0xf];
  auVar70 = packsswb(auVar129,auVar66);
  auVar66 = packsswb(auVar88,auVar160);
  cVar182 = auVar70[7] + -0x80;
  uVar21 = CONCAT11(uStack_bc._3_1_ + -0x80,cStack_c9 + -0x80);
  uVar115 = CONCAT31(CONCAT21(uVar21,uStack_bc._2_1_ + -0x80),cStack_ca + -0x80);
  uVar20 = CONCAT51(CONCAT41(uVar115,uStack_bc._1_1_ + -0x80),cStack_cb + -0x80);
  Var14 = CONCAT72(CONCAT61(uVar20,(char)uStack_bc + -0x80),
                   CONCAT11(cStack_cc + -0x80,cStack_c9 + -0x80));
  Var9 = CONCAT91(CONCAT81((long)((unkuint9)Var14 >> 8),uStack_c0._3_1_ + -0x80),cStack_cd + -0x80);
  auVar8._2_10_ = Var9;
  auVar8[1] = uStack_c0._2_1_ + -0x80;
  auVar8[0] = cStack_ce + -0x80;
  auVar7._2_12_ = auVar8;
  auVar7[1] = uStack_c0._1_1_ + -0x80;
  auVar7[0] = cStack_cf + -0x80;
  uVar210 = CONCAT11((char)uStack_c0 + -0x80,cStack_d0 + -0x80);
  auVar200._2_14_ = auVar7;
  uVar24 = CONCAT11((char)uStack_b8 + -0x80,(char)uStack_c8 + -0x80);
  uVar29 = CONCAT13(uStack_b8._1_1_ + -0x80,CONCAT12(uStack_c8._1_1_ + -0x80,uVar24));
  uVar30 = CONCAT15(uStack_b8._2_1_ + -0x80,CONCAT14(uStack_c8._2_1_ + -0x80,uVar29));
  uVar31 = CONCAT17(uStack_b8._3_1_ + -0x80,CONCAT16(uStack_c8._3_1_ + -0x80,uVar30));
  auVar33._0_10_ = CONCAT19((char)uStack_b4 + -0x80,CONCAT18(cStack_c4 + -0x80,uVar31));
  auVar33[10] = cStack_c3 + -0x80;
  auVar33[0xb] = uStack_b4._1_1_ + -0x80;
  auVar34[0xc] = cStack_c2 + -0x80;
  auVar34._0_12_ = auVar33;
  auVar34[0xd] = uStack_b4._2_1_ + -0x80;
  auVar52[0xe] = cStack_c1 + -0x80;
  auVar52._0_14_ = auVar34;
  auVar52[0xf] = uStack_b4._3_1_ + -0x80;
  uVar23 = CONCAT11(auVar66[7] + -0x80,cVar182);
  uVar138 = CONCAT31(CONCAT21(uVar23,auVar66[6] + -0x80),auVar70[6] + -0x80);
  uVar22 = CONCAT51(CONCAT41(uVar138,auVar66[5] + -0x80),auVar70[5] + -0x80);
  Var15 = CONCAT72(CONCAT61(uVar22,auVar66[4] + -0x80),CONCAT11(auVar70[4] + -0x80,cVar182));
  Var12 = CONCAT91(CONCAT81((long)((unkuint9)Var15 >> 8),auVar66[3] + -0x80),auVar70[3] + -0x80);
  auVar11._2_10_ = Var12;
  auVar11[1] = auVar66[2] + -0x80;
  auVar11[0] = auVar70[2] + -0x80;
  auVar10._2_12_ = auVar11;
  auVar10[1] = auVar66[1] + -0x80;
  auVar10[0] = auVar70[1] + -0x80;
  uVar77 = CONCAT11(auVar66[8] + -0x80,auVar70[8] + -0x80);
  auVar92._0_4_ = CONCAT13(auVar66[9] + -0x80,CONCAT12(auVar70[9] + -0x80,uVar77));
  auVar93._0_6_ = CONCAT15(auVar66[10] + -0x80,CONCAT14(auVar70[10] + -0x80,auVar92._0_4_));
  auVar94._0_8_ = CONCAT17(auVar66[0xb] + -0x80,CONCAT16(auVar70[0xb] + -0x80,auVar93._0_6_));
  auVar79._0_10_ = CONCAT19(auVar66[0xc] + -0x80,CONCAT18(auVar70[0xc] + -0x80,auVar94._0_8_));
  auVar79[10] = auVar70[0xd] + -0x80;
  auVar79[0xb] = auVar66[0xd] + -0x80;
  auVar80[0xc] = auVar70[0xe] + -0x80;
  auVar80._0_12_ = auVar79;
  auVar80[0xd] = auVar66[0xe] + -0x80;
  auVar91[0xe] = auVar70[0xf] + -0x80;
  auVar91._0_14_ = auVar80;
  auVar91[0xf] = auVar66[0xf] + -0x80;
  auVar203._0_12_ = auVar200._0_12_;
  auVar203._12_2_ = (short)Var9;
  auVar203._14_2_ = (short)Var12;
  auVar202._12_4_ = auVar203._12_4_;
  auVar202._0_10_ = auVar200._0_10_;
  auVar202._10_2_ = auVar11._0_2_;
  auVar201._10_6_ = auVar202._10_6_;
  auVar201._0_8_ = auVar200._0_8_;
  auVar201._8_2_ = auVar8._0_2_;
  auVar13._4_8_ = auVar201._8_8_;
  auVar13._2_2_ = auVar10._0_2_;
  auVar13._0_2_ = auVar7._0_2_;
  uVar120 = CONCAT22((short)((unkuint9)Var15 >> 8),(short)((unkuint9)Var14 >> 8));
  auVar123._0_8_ = CONCAT26((short)uVar22,CONCAT24((short)uVar20,uVar120));
  auVar123._8_2_ = (short)uVar115;
  auVar123._10_2_ = (short)uVar138;
  auVar133._12_2_ = uVar21;
  auVar133._0_12_ = auVar123;
  auVar133._14_2_ = uVar23;
  auVar96._12_2_ = (short)((ulong)auVar94._0_8_ >> 0x30);
  auVar96._0_12_ = auVar79;
  auVar96._14_2_ = (short)((ulong)uVar31 >> 0x30);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._10_2_ = (short)((uint6)uVar30 >> 0x20);
  auVar95._0_10_ = auVar79._0_10_;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = (short)((uint6)auVar93._0_6_ >> 0x20);
  auVar93._8_8_ = auVar94._8_8_;
  auVar93._6_2_ = (short)((uint)uVar29 >> 0x10);
  auVar92._6_10_ = auVar93._6_10_;
  auVar92._4_2_ = (short)((uint)auVar92._0_4_ >> 0x10);
  uVar115 = CONCAT22((short)((unkuint10)auVar33._0_10_ >> 0x40),
                     (short)((unkuint10)auVar79._0_10_ >> 0x40));
  auVar147._0_8_ = CONCAT26(auVar33._10_2_,CONCAT24(auVar79._10_2_,uVar115));
  auVar147._8_2_ = auVar80._12_2_;
  auVar147._10_2_ = auVar34._12_2_;
  auVar163._12_2_ = auVar91._14_2_;
  auVar163._0_12_ = auVar147;
  auVar163._14_2_ = auVar52._14_2_;
  uVar31 = CONCAT44(auVar95._12_4_,auVar202._12_4_);
  pJVar2 = output_buf[2];
  *(ulong *)(*output_buf + output_col) =
       CONCAT44(CONCAT22(uVar24,uVar77),
                CONCAT22(CONCAT11(auVar66[0] + -0x80,auVar70[0] + -0x80),uVar210));
  *(ulong *)(pJVar2 + output_col) = CONCAT44(auVar94._8_4_,auVar201._8_4_);
  pJVar2 = output_buf[6];
  *(ulong *)(output_buf[4] + output_col) = CONCAT44(uVar115,uVar120);
  *(ulong *)(pJVar2 + output_col) = CONCAT44(auVar147._8_4_,auVar123._8_4_);
  pJVar2 = output_buf[3];
  *(ulong *)(output_buf[1] + output_col) = CONCAT44(auVar92._4_4_,auVar13._0_4_);
  *(undefined8 *)(pJVar2 + output_col) = uVar31;
  pJVar2 = output_buf[7];
  *(ulong *)(output_buf[5] + output_col) =
       CONCAT44((int)((ulong)auVar147._0_8_ >> 0x20),(int)((ulong)auVar123._0_8_ >> 0x20));
  *(ulong *)(pJVar2 + output_col) = CONCAT44(auVar163._12_4_,auVar133._12_4_);
  return;
}

Assistant:

GLOBAL(void)
jsimd_idct_islow(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                 JCOEFPTR coef_block, JSAMPARRAY output_buf,
                 JDIMENSION output_col)
{
  if (simd_support & JSIMD_AVX2)
    jsimd_idct_islow_avx2(compptr->dct_table, coef_block, output_buf,
                          output_col);
  else
    jsimd_idct_islow_sse2(compptr->dct_table, coef_block, output_buf,
                          output_col);
}